

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O3

void __thiscall Fl_Input_Choice_Type::build_menu(Fl_Input_Choice_Type *this)

{
  int *piVar1;
  Fl_Widget *pFVar2;
  void *pvVar3;
  Fl_Type *pFVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  Fl_Menu_Item *m;
  Fl_Type *pFVar8;
  char *pcVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  Fl_Menu_Item_Type *i;
  Fl_Type *pFVar13;
  long *plVar14;
  
  pFVar13 = (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.next;
  pFVar2 = (this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  if (pFVar13 != (Fl_Type *)0x0) {
    iVar11 = 0;
    do {
      if (pFVar13->level <= (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.level)
      break;
      iVar6 = (*pFVar13->_vptr_Fl_Type[0x16])(pFVar13);
      iVar11 = (iVar11 - (uint)(iVar6 == 0)) + 2;
      pFVar13 = pFVar13->next;
    } while (pFVar13 != (Fl_Type *)0x0);
    if (iVar11 != 0) {
      iVar6 = (this->super_Fl_Menu_Type).menusize;
      if (iVar6 <= iVar11) {
        if ((iVar6 != 0) &&
           (pvVar3 = *(void **)(pFVar2[1].label_.value + 0x78), pvVar3 != (void *)0x0)) {
          operator_delete__(pvVar3);
        }
        (this->super_Fl_Menu_Type).menusize = iVar11 + 0xb;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (long)(iVar11 + 0xb);
        uVar12 = 0xffffffffffffffff;
        if (SUB168(auVar5 * ZEXT816(0x38),8) == 0) {
          uVar12 = SUB168(auVar5 * ZEXT816(0x38),0);
        }
        m = (Fl_Menu_Item *)operator_new__(uVar12);
        Fl_Menu_::menu((Fl_Menu_ *)pFVar2[1].label_.value,m);
      }
      pFVar13 = (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.next;
      if (pFVar13 != (Fl_Type *)0x0) {
        piVar1 = &(this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.level;
        iVar11 = *piVar1 + 1;
        plVar14 = *(long **)(pFVar2[1].label_.value + 0x78);
        do {
          if (pFVar13->level <= *piVar1) break;
          pFVar8 = pFVar13[1].prev;
          pFVar4 = pFVar8->parent;
          if (pFVar4 == (Fl_Type *)0x0) {
            pcVar9 = pFVar8->comment_;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = "(nolabel)";
            }
            *plVar14 = (long)pcVar9;
            *(undefined1 *)((long)plVar14 + 0x24) = *(undefined1 *)&pFVar8->prev;
          }
          else {
            (*pFVar4->_vptr_Fl_Type[6])(pFVar4,plVar14);
            pFVar8 = pFVar13[1].prev;
          }
          *(undefined4 *)(plVar14 + 1) = *(undefined4 *)&pFVar8[1]._vptr_Fl_Type;
          plVar14[2] = 0;
          plVar14[3] = (long)pFVar13;
          iVar6 = Fl_Menu_Item_Type::flags((Fl_Menu_Item_Type *)pFVar13);
          *(int *)(plVar14 + 4) = iVar6;
          pFVar4 = pFVar13[1].prev;
          plVar14[5] = *(long *)&pFVar4->level;
          *(undefined4 *)(plVar14 + 6) = *(undefined4 *)&pFVar4->next;
          iVar7 = (*pFVar13->_vptr_Fl_Type[0x16])(pFVar13);
          iVar6 = iVar11;
          if (iVar7 != 0) {
            iVar6 = iVar11 + 1;
            *(byte *)(plVar14 + 4) = *(byte *)(plVar14 + 4) | 0x40;
          }
          piVar10 = piVar1;
          if ((pFVar13->next != (Fl_Type *)0x0) &&
             (iVar11 = (*pFVar13->next->_vptr_Fl_Type[0x1e])(), iVar11 != 0)) {
            piVar10 = &pFVar13->next->level;
          }
          iVar11 = *piVar10;
          for (; plVar14 = plVar14 + 7, iVar11 < iVar6; iVar6 = iVar6 + -1) {
            *plVar14 = 0;
          }
          pFVar13 = pFVar13->next;
        } while (pFVar13 != (Fl_Type *)0x0);
      }
      goto LAB_0017e043;
    }
  }
  if (((this->super_Fl_Menu_Type).menusize != 0) &&
     (pvVar3 = *(void **)(pFVar2[1].label_.value + 0x78), pvVar3 != (void *)0x0)) {
    operator_delete__(pvVar3);
  }
  Fl_Menu_::menu((Fl_Menu_ *)pFVar2[1].label_.value,(Fl_Menu_Item *)0x0);
  (this->super_Fl_Menu_Type).menusize = 0;
LAB_0017e043:
  Fl_Widget::redraw((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  return;
}

Assistant:

void Fl_Input_Choice_Type::build_menu() {
  Fl_Input_Choice* w = (Fl_Input_Choice*)o;
  // count how many Fl_Menu_Item structures needed:
  int n = 0;
  Fl_Type* q;
  for (q = next; q && q->level > level; q = q->next) {
    if (q->is_parent()) n++; // space for null at end of submenu
    n++;
  }
  if (!n) {
    if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
    w->menu(0);
    menusize = 0;
  } else {
    n++; // space for null at end of menu
    if (menusize<n) {
      if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
      menusize = n+10;
      w->menu(new Fl_Menu_Item[menusize]);
    }
    // fill them all in:
    Fl_Menu_Item* m = (Fl_Menu_Item*)(w->menu());
    int lvl = level+1;
    for (q = next; q && q->level > level; q = q->next) {
      Fl_Menu_Item_Type* i = (Fl_Menu_Item_Type*)q;
      if (i->o->image()) i->o->image()->label(m);
      else {
        m->label(i->o->label() ? i->o->label() : "(nolabel)");
        m->labeltype(i->o->labeltype());
      }
      m->shortcut(((Fl_Button*)(i->o))->shortcut());
      m->callback(0,(void*)i);
      m->flags = i->flags();
      m->labelfont(i->o->labelfont());
      m->labelsize(i->o->labelsize());
      m->labelcolor(i->o->labelcolor());
      if (q->is_parent()) {lvl++; m->flags |= FL_SUBMENU;}
      m++;
      int l1 =
	(q->next && q->next->is_menu_item()) ? q->next->level : level;
      while (lvl > l1) {m->label(0); m++; lvl--;}
      lvl = l1;
    }
  }
  o->redraw();
}